

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallRuntimeDependencySetGenerator.cxx
# Opt level: O1

void __thiscall
cmInstallRuntimeDependencySetGenerator::GenerateScriptForConfig
          (cmInstallRuntimeDependencySetGenerator *this,ostream *os,string *config,Indent indent)

{
  pointer *ppbVar1;
  bool bVar2;
  cmMakefile *pcVar3;
  char *pcVar4;
  size_type sVar5;
  pointer pbVar6;
  pointer pcVar7;
  cmInstallRuntimeDependencySetGenerator *this_00;
  int iVar8;
  string *psVar9;
  size_t sVar10;
  ostream *poVar11;
  cmake *this_01;
  ostream *poVar12;
  Indent IVar13;
  Indent IVar14;
  WrapQuotes wrapQuotes;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *files;
  pointer pbVar15;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string_view str;
  string installNameDir;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  evaluatedRPaths;
  string depVar;
  string local_100;
  ostream *local_e0;
  cmInstallRuntimeDependencySetGenerator *local_d8;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  pcVar3 = this->LocalGenerator->Makefile;
  installNameDir._M_dataplus._M_p = (pointer)&installNameDir.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&installNameDir,"CMAKE_INSTALL_NAME_TOOL","");
  psVar9 = cmMakefile::GetSafeDefinition(pcVar3,&installNameDir);
  iVar8 = (int)os;
  if (psVar9->_M_string_length == 0) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)installNameDir._M_dataplus._M_p != &installNameDir.field_2) {
      operator_delete(installNameDir._M_dataplus._M_p,
                      installNameDir.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    bVar2 = this->NoInstallName;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)installNameDir._M_dataplus._M_p != &installNameDir.field_2) {
      operator_delete(installNameDir._M_dataplus._M_p,
                      installNameDir.field_2._M_allocated_capacity + 1);
    }
    if (bVar2 == false) {
      installNameDir._M_dataplus._M_p = (pointer)&installNameDir.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&installNameDir,"@rpath/","");
      if ((this->InstallNameDir)._M_string_length == 0) {
LAB_004eeb6f:
        IVar13.Level = indent.Level;
        if (0 < indent.Level) {
          do {
            std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
            IVar13.Level = IVar13.Level + -1;
          } while (IVar13.Level != 0);
        }
        std::__ostream_insert<char,std::char_traits<char>>(os,"set(",4);
        pcVar4 = this->TmpVarPrefix;
        if (pcVar4 == (char *)0x0) {
          std::ios::clear(iVar8 + (int)os->_vptr_basic_ostream[-3]);
        }
        else {
          sVar10 = strlen(pcVar4);
          std::__ostream_insert<char,std::char_traits<char>>(os,pcVar4,sVar10);
        }
        std::__ostream_insert<char,std::char_traits<char>>(os,"_install_name_dir \"",0x13);
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            (os,installNameDir._M_dataplus._M_p,installNameDir._M_string_length);
        bVar2 = true;
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\")\n",3);
      }
      else {
        std::__cxx11::string::_M_assign((string *)&installNameDir);
        depVar._M_dataplus._M_p = (pointer)&depVar.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&depVar,"${CMAKE_INSTALL_PREFIX}","");
        cmGeneratorExpression::ReplaceInstallPrefix(&installNameDir,&depVar);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)depVar._M_dataplus._M_p != &depVar.field_2) {
          operator_delete(depVar._M_dataplus._M_p,
                          CONCAT71(depVar.field_2._M_allocated_capacity._1_7_,
                                   depVar.field_2._M_local_buf[0]) + 1);
        }
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_70,installNameDir._M_dataplus._M_p,
                   installNameDir._M_dataplus._M_p + installNameDir._M_string_length);
        ppbVar1 = &evaluatedRPaths.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
        evaluatedRPaths.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        evaluatedRPaths.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)((ulong)evaluatedRPaths.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage &
                      0xffffffffffffff00);
        evaluatedRPaths.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar1;
        cmGeneratorExpression::Evaluate
                  (&depVar,&local_70,this->LocalGenerator,config,(cmGeneratorTarget *)0x0,
                   (cmGeneratorExpressionDAGChecker *)0x0,(cmGeneratorTarget *)0x0,
                   (string *)&evaluatedRPaths);
        std::__cxx11::string::operator=((string *)&installNameDir,(string *)&depVar);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)depVar._M_dataplus._M_p != &depVar.field_2) {
          operator_delete(depVar._M_dataplus._M_p,
                          CONCAT71(depVar.field_2._M_allocated_capacity._1_7_,
                                   depVar.field_2._M_local_buf[0]) + 1);
        }
        if (evaluatedRPaths.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar1) {
          operator_delete(evaluatedRPaths.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (ulong)((long)&((evaluatedRPaths.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                         _M_dataplus)._M_p + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        if (installNameDir._M_string_length != 0) {
          if (installNameDir._M_dataplus._M_p[installNameDir._M_string_length - 1] != '/') {
            std::__cxx11::string::push_back((char)&installNameDir);
          }
          goto LAB_004eeb6f;
        }
        this_01 = cmMakefile::GetCMakeInstance(this->LocalGenerator->Makefile);
        depVar._M_dataplus._M_p = (pointer)&depVar.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&depVar,
                   "INSTALL_NAME_DIR argument must not evaluate to an empty string","");
        cmake::IssueMessage(this_01,FATAL_ERROR,&depVar,&(this->super_cmInstallGenerator).Backtrace)
        ;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)depVar._M_dataplus._M_p != &depVar.field_2) {
          operator_delete(depVar._M_dataplus._M_p,
                          CONCAT71(depVar.field_2._M_allocated_capacity._1_7_,
                                   depVar.field_2._M_local_buf[0]) + 1);
        }
        bVar2 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)installNameDir._M_dataplus._M_p != &installNameDir.field_2) {
        operator_delete(installNameDir._M_dataplus._M_p,
                        installNameDir.field_2._M_allocated_capacity + 1);
      }
      if (!bVar2) {
        return;
      }
    }
  }
  IVar13.Level = indent.Level;
  if (0 < indent.Level) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
      IVar13.Level = IVar13.Level + -1;
    } while (IVar13.Level != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"foreach(",8);
  pcVar4 = this->TmpVarPrefix;
  if (pcVar4 == (char *)0x0) {
    std::ios::clear(iVar8 + (int)os->_vptr_basic_ostream[-3]);
  }
  else {
    sVar10 = strlen(pcVar4);
    std::__ostream_insert<char,std::char_traits<char>>(os,pcVar4,sVar10);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"_dep IN LISTS ",0xe);
  pcVar4 = this->DepsVar;
  if (pcVar4 == (char *)0x0) {
    std::ios::clear(iVar8 + (int)os->_vptr_basic_ostream[-3]);
  }
  else {
    sVar10 = strlen(pcVar4);
    std::__ostream_insert<char,std::char_traits<char>>(os,pcVar4,sVar10);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,")\n",2);
  pcVar3 = this->LocalGenerator->Makefile;
  installNameDir._M_dataplus._M_p = (pointer)&installNameDir.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&installNameDir,"CMAKE_INSTALL_NAME_TOOL","");
  psVar9 = cmMakefile::GetSafeDefinition(pcVar3,&installNameDir);
  sVar5 = psVar9->_M_string_length;
  local_e0 = os;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)installNameDir._M_dataplus._M_p != &installNameDir.field_2) {
    operator_delete(installNameDir._M_dataplus._M_p,installNameDir.field_2._M_allocated_capacity + 1
                   );
  }
  if (sVar5 != 0) {
    evaluatedRPaths.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    evaluatedRPaths.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    evaluatedRPaths.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pbVar15 = (this->InstallRPaths).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pbVar6 = (this->InstallRPaths).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pbVar15 != pbVar6) {
      do {
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        pcVar7 = (pbVar15->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_90,pcVar7,pcVar7 + pbVar15->_M_string_length);
        depVar._M_string_length = 0;
        depVar.field_2._M_local_buf[0] = '\0';
        depVar._M_dataplus._M_p = (pointer)&depVar.field_2;
        cmGeneratorExpression::Evaluate
                  (&installNameDir,&local_90,this->LocalGenerator,config,(cmGeneratorTarget *)0x0,
                   (cmGeneratorExpressionDAGChecker *)0x0,(cmGeneratorTarget *)0x0,&depVar);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)depVar._M_dataplus._M_p != &depVar.field_2) {
          operator_delete(depVar._M_dataplus._M_p,
                          CONCAT71(depVar.field_2._M_allocated_capacity._1_7_,
                                   depVar.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        if (installNameDir._M_string_length != 0) {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &evaluatedRPaths,&installNameDir);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)installNameDir._M_dataplus._M_p != &installNameDir.field_2) {
          operator_delete(installNameDir._M_dataplus._M_p,
                          installNameDir.field_2._M_allocated_capacity + 1);
        }
        pbVar15 = pbVar15 + 1;
      } while (pbVar15 != pbVar6);
    }
    poVar11 = local_e0;
    if (this->Type == Library) {
      GenerateAppleLibraryScript(this,local_e0,config,&evaluatedRPaths,(Indent)(indent.Level + 2));
    }
    else if (this->Type == Framework) {
      GenerateAppleFrameworkScript(this,local_e0,config,&evaluatedRPaths,(Indent)(indent.Level + 2))
      ;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&evaluatedRPaths);
    goto LAB_004ef117;
  }
  pcVar4 = this->TmpVarPrefix;
  installNameDir._M_dataplus._M_p = (pointer)strlen(pcVar4);
  installNameDir.field_2._M_allocated_capacity = 4;
  installNameDir.field_2._8_8_ = anon_var_dwarf_203e847;
  views._M_len = 2;
  views._M_array = (iterator)&installNameDir;
  installNameDir._M_string_length = (size_type)pcVar4;
  cmCatViews_abi_cxx11_(&depVar,views);
  GetDestination(&installNameDir,this,config);
  poVar11 = local_e0;
  files = &evaluatedRPaths;
  evaluatedRPaths.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  evaluatedRPaths.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  evaluatedRPaths.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  IVar13.Level = indent.Level + 2;
  cmInstallGenerator::AddInstallRule
            (&this->super_cmInstallGenerator,local_e0,&installNameDir,cmInstallType_SHARED_LIBRARY,
             files,false,(this->Permissions)._M_dataplus._M_p,(char *)0x0,(char *)0x0,
             " FOLLOW_SYMLINK_CHAIN",IVar13,depVar._M_dataplus._M_p);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&evaluatedRPaths);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)installNameDir._M_dataplus._M_p != &installNameDir.field_2) {
    operator_delete(installNameDir._M_dataplus._M_p,installNameDir.field_2._M_allocated_capacity + 1
                   );
  }
  pcVar3 = this->LocalGenerator->Makefile;
  installNameDir._M_dataplus._M_p = (pointer)&installNameDir.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&installNameDir,"CMAKE_SYSTEM_NAME","");
  psVar9 = cmMakefile::GetSafeDefinition(pcVar3,&installNameDir);
  iVar8 = std::__cxx11::string::compare((char *)psVar9);
  if (iVar8 == 0) {
    bVar2 = this->NoInstallRPath;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)installNameDir._M_dataplus._M_p != &installNameDir.field_2) {
      operator_delete(installNameDir._M_dataplus._M_p,
                      installNameDir.field_2._M_allocated_capacity + 1);
    }
    if (bVar2 == false) {
      installNameDir._M_dataplus._M_p = (pointer)&installNameDir.field_2;
      installNameDir._M_string_length = 0;
      installNameDir.field_2._M_allocated_capacity =
           installNameDir.field_2._M_allocated_capacity & 0xffffffffffffff00;
      pbVar15 = (this->InstallRPaths).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar6 = (this->InstallRPaths).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_d8 = this;
      if (pbVar15 != pbVar6) {
        do {
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          pcVar7 = (pbVar15->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_b0,pcVar7,pcVar7 + pbVar15->_M_string_length);
          local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
          local_100._M_string_length = 0;
          local_100.field_2._M_local_buf[0] = '\0';
          files = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)0x0;
          cmGeneratorExpression::Evaluate
                    ((string *)&evaluatedRPaths,&local_b0,local_d8->LocalGenerator,config,
                     (cmGeneratorTarget *)0x0,(cmGeneratorExpressionDAGChecker *)0x0,
                     (cmGeneratorTarget *)0x0,&local_100);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_100._M_dataplus._M_p != &local_100.field_2) {
            operator_delete(local_100._M_dataplus._M_p,
                            CONCAT71(local_100.field_2._M_allocated_capacity._1_7_,
                                     local_100.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
          }
          if (evaluatedRPaths.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
            if (installNameDir._M_string_length == 0) {
              std::__cxx11::string::operator=((string *)&installNameDir,(string *)&evaluatedRPaths);
            }
            else {
              std::__cxx11::string::push_back((char)&installNameDir);
              std::__cxx11::string::_M_append
                        ((char *)&installNameDir,
                         (ulong)evaluatedRPaths.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
            }
          }
          if (evaluatedRPaths.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              (pointer)&evaluatedRPaths.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            operator_delete(evaluatedRPaths.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (ulong)((long)&((evaluatedRPaths.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                           _M_dataplus)._M_p + 1));
          }
          pbVar15 = pbVar15 + 1;
        } while (pbVar15 != pbVar6);
      }
      IVar14.Level = IVar13.Level;
      if (-2 < indent.Level) {
        do {
          std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
          IVar14.Level = IVar14.Level + -1;
        } while (IVar14.Level != 0);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"get_filename_component(",0x17);
      this_00 = local_d8;
      pcVar4 = local_d8->TmpVarPrefix;
      if (pcVar4 == (char *)0x0) {
        std::ios::clear((int)poVar11 + (int)poVar11->_vptr_basic_ostream[-3]);
      }
      else {
        sVar10 = strlen(pcVar4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar4,sVar10);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"_dep_name \"${",0xd);
      pcVar4 = this_00->TmpVarPrefix;
      if (pcVar4 == (char *)0x0) {
        std::ios::clear((int)poVar11 + (int)poVar11->_vptr_basic_ostream[-3]);
      }
      else {
        sVar10 = strlen(pcVar4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar4,sVar10);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"_dep}\" NAME)\n",0xd);
      wrapQuotes = (WrapQuotes)files;
      if (installNameDir._M_string_length == 0) {
        if (-2 < indent.Level) {
          do {
            std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
            IVar13.Level = IVar13.Level + -1;
          } while (IVar13.Level != 0);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"file(RPATH_REMOVE FILE \"",0x18)
        ;
        GetDestination(&local_d0,this_00,config);
        cmInstallGenerator::ConvertToAbsoluteDestination(&local_100,&local_d0);
        cmInstallGenerator::GetDestDirPath((string *)&evaluatedRPaths,&local_100);
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar11,(char *)evaluatedRPaths.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start,
                             (long)evaluatedRPaths.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,"/${",3);
        pcVar4 = this_00->TmpVarPrefix;
        if (pcVar4 == (char *)0x0) {
          std::ios::clear((int)poVar12 + (int)poVar12->_vptr_basic_ostream[-3]);
        }
        else {
          sVar10 = strlen(pcVar4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,pcVar4,sVar10);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,"_dep_name}\")\n",0xd);
      }
      else {
        if (-2 < indent.Level) {
          do {
            std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
            wrapQuotes = (WrapQuotes)files;
            IVar13.Level = IVar13.Level + -1;
          } while (IVar13.Level != 0);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"file(RPATH_SET FILE \"",0x15);
        GetDestination(&local_d0,this_00,config);
        cmInstallGenerator::ConvertToAbsoluteDestination(&local_100,&local_d0);
        cmInstallGenerator::GetDestDirPath((string *)&evaluatedRPaths,&local_100);
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar11,(char *)evaluatedRPaths.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start,
                             (long)evaluatedRPaths.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,"/${",3);
        pcVar4 = this_00->TmpVarPrefix;
        if (pcVar4 == (char *)0x0) {
          std::ios::clear((int)poVar12 + (int)poVar12->_vptr_basic_ostream[-3]);
        }
        else {
          sVar10 = strlen(pcVar4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,pcVar4,sVar10);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,"_dep_name}\" NEW_RPATH ",0x16);
        str._M_str = (char *)0x0;
        str._M_len = (size_t)installNameDir._M_dataplus._M_p;
        cmOutputConverter::EscapeForCMake_abi_cxx11_
                  (&local_50,(cmOutputConverter *)installNameDir._M_string_length,str,wrapQuotes);
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar12,local_50._M_dataplus._M_p,local_50._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,")\n",2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
      if (evaluatedRPaths.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pointer)&evaluatedRPaths.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        operator_delete(evaluatedRPaths.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (ulong)((long)&((evaluatedRPaths.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                       _M_dataplus)._M_p + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p,
                        CONCAT71(local_100.field_2._M_allocated_capacity._1_7_,
                                 local_100.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      goto LAB_004ef082;
    }
  }
  else {
LAB_004ef082:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)installNameDir._M_dataplus._M_p != &installNameDir.field_2) {
      operator_delete(installNameDir._M_dataplus._M_p,
                      installNameDir.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)depVar._M_dataplus._M_p != &depVar.field_2) {
    operator_delete(depVar._M_dataplus._M_p,
                    CONCAT71(depVar.field_2._M_allocated_capacity._1_7_,
                             depVar.field_2._M_local_buf[0]) + 1);
  }
LAB_004ef117:
  if (0 < indent.Level) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
      indent.Level = indent.Level + -1;
    } while (indent.Level != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"endforeach()\n",0xd);
  return;
}

Assistant:

void cmInstallRuntimeDependencySetGenerator::GenerateScriptForConfig(
  std::ostream& os, const std::string& config, Indent indent)
{
  if (!this->LocalGenerator->GetMakefile()
         ->GetSafeDefinition("CMAKE_INSTALL_NAME_TOOL")
         .empty() &&
      !this->NoInstallName) {
    std::string installNameDir = "@rpath/";
    if (!this->InstallNameDir.empty()) {
      installNameDir = this->InstallNameDir;
      cmGeneratorExpression::ReplaceInstallPrefix(installNameDir,
                                                  "${CMAKE_INSTALL_PREFIX}");
      installNameDir = cmGeneratorExpression::Evaluate(
        installNameDir, this->LocalGenerator, config);
      if (installNameDir.empty()) {
        this->LocalGenerator->GetMakefile()->GetCMakeInstance()->IssueMessage(
          MessageType::FATAL_ERROR,
          "INSTALL_NAME_DIR argument must not evaluate to an "
          "empty string",
          this->Backtrace);
        return;
      }
      if (installNameDir.back() != '/') {
        installNameDir += '/';
      }
    }
    os << indent << "set(" << this->TmpVarPrefix << "_install_name_dir \""
       << installNameDir << "\")\n";
  }

  os << indent << "foreach(" << this->TmpVarPrefix << "_dep IN LISTS "
     << this->DepsVar << ")\n";

  if (!this->LocalGenerator->GetMakefile()
         ->GetSafeDefinition("CMAKE_INSTALL_NAME_TOOL")
         .empty()) {
    std::vector<std::string> evaluatedRPaths;
    for (auto const& rpath : this->InstallRPaths) {
      std::string result =
        cmGeneratorExpression::Evaluate(rpath, this->LocalGenerator, config);
      if (!result.empty()) {
        evaluatedRPaths.push_back(std::move(result));
      }
    }

    switch (this->Type) {
      case DependencyType::Library:
        this->GenerateAppleLibraryScript(os, config, evaluatedRPaths,
                                         indent.Next());
        break;
      case DependencyType::Framework:
        this->GenerateAppleFrameworkScript(os, config, evaluatedRPaths,
                                           indent.Next());
        break;
    }
  } else {
    std::string depVar = cmStrCat(this->TmpVarPrefix, "_dep");

    this->AddInstallRule(
      os, this->GetDestination(config), cmInstallType_SHARED_LIBRARY, {},
      false, this->Permissions.c_str(), nullptr, nullptr,
      " FOLLOW_SYMLINK_CHAIN", indent.Next(), depVar.c_str());

    if (this->LocalGenerator->GetMakefile()->GetSafeDefinition(
          "CMAKE_SYSTEM_NAME") == "Linux" &&
        !this->NoInstallRPath) {
      std::string evaluatedRPath;
      for (auto const& rpath : this->InstallRPaths) {
        std::string result =
          cmGeneratorExpression::Evaluate(rpath, this->LocalGenerator, config);
        if (!result.empty()) {
          if (evaluatedRPath.empty()) {
            evaluatedRPath = std::move(result);
          } else {
            evaluatedRPath += ':';
            evaluatedRPath += result;
          }
        }
      }

      os << indent.Next() << "get_filename_component(" << this->TmpVarPrefix
         << "_dep_name \"${" << this->TmpVarPrefix << "_dep}\" NAME)\n";
      if (evaluatedRPath.empty()) {
        os << indent.Next() << "file(RPATH_REMOVE FILE \""
           << GetDestDirPath(
                ConvertToAbsoluteDestination(this->GetDestination(config)))
           << "/${" << this->TmpVarPrefix << "_dep_name}\")\n";
      } else {
        os << indent.Next() << "file(RPATH_SET FILE \""
           << GetDestDirPath(
                ConvertToAbsoluteDestination(this->GetDestination(config)))
           << "/${" << this->TmpVarPrefix << "_dep_name}\" NEW_RPATH "
           << cmOutputConverter::EscapeForCMake(evaluatedRPath) << ")\n";
      }
    }
  }

  os << indent << "endforeach()\n";
}